

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rigid-body-kinematics.hxx
# Opt level: O1

Kinematics * __thiscall
stateObservation::kine::Kinematics::setToProductNoAlias
          (Kinematics *__return_storage_ptr__,Kinematics *this,Kinematics *multiplier1,
          Kinematics *multiplier2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  undefined *puVar22;
  long lVar23;
  char *__function;
  SrcEvaluatorType srcEvaluator;
  Matrix<double,_3,_3,_0,_3,_3> *pMVar24;
  Matrix<double,_3,_3,_0,_3,_3> *pMVar25;
  byte bVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  Vector3 local_58;
  Matrix<double,_3,_1,_0,_3,_1> *local_40;
  Vector3 *local_38;
  
  bVar26 = 0;
  if (((multiplier1->orientation).m_.isSet_.b_ == false) &&
     (((multiplier1->orientation).q_.isSet_.b_ & 1U) == 0)) {
    __assert_fail("multiplier1.orientation.isSet() && \"The multiplier 1 orientation is not initialized, the multiplication is not possible.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/rigid-body-kinematics.hxx"
                  ,0x67d,
                  "Kinematics stateObservation::kine::Kinematics::setToProductNoAlias(const Kinematics &, const Kinematics &)"
                 );
  }
  if ((multiplier2->position).isSet_.b_ == false) {
    if (((multiplier2->orientation).m_.isSet_.b_ == false) &&
       (((multiplier2->orientation).q_.isSet_.b_ & 1U) == 0)) {
      __assert_fail("(multiplier2.position.isSet() || multiplier2.orientation.isSet()) && \"The multiplier 2 kinematics is not initialized, the multiplication is not possible.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/rigid-body-kinematics.hxx"
                    ,0x680,
                    "Kinematics stateObservation::kine::Kinematics::setToProductNoAlias(const Kinematics &, const Kinematics &)"
                   );
    }
LAB_0017a8ed:
    (this->position).isSet_.b_ = false;
    (this->linVel).isSet_.b_ = false;
    (this->linAcc).isSet_.b_ = false;
LAB_0017a963:
    if (((multiplier2->orientation).m_.isSet_.b_ == false) &&
       (((multiplier2->orientation).q_.isSet_.b_ & 1U) == 0)) {
      (this->orientation).q_.isSet_.b_ = false;
      (this->orientation).m_.isSet_.b_ = false;
    }
    else {
      Orientation::setToProductNoAlias
                (&this->orientation,&multiplier1->orientation,&multiplier2->orientation);
      if (((multiplier2->angVel).isSet_.b_ == true) && ((multiplier1->angVel).isSet_.b_ == true)) {
        (this->angVel).isSet_.b_ = true;
        if ((((this->angVel).assertMsg_.b_ != (char *)0x0) &&
            ((multiplier2->angVel).isSet_.b_ == true)) &&
           ((multiplier2->angVel).assertMsg_.b_ != (char *)0x0)) {
          bVar5 = (multiplier1->orientation).q_.isSet_.b_;
          if ((bVar5 == false) && ((multiplier1->orientation).m_.isSet_.b_ == false))
          goto LAB_0017b28e;
          if ((multiplier1->orientation).m_.isSet_.b_ == false) {
            if ((bVar5 == false) || ((multiplier1->orientation).q_.assertMsg_.b_ == (char *)0x0))
            goto LAB_0017b2ad;
            dVar1 = (multiplier1->orientation).q_.v_.m_coeffs.
                    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                    array[0];
            dVar2 = *(double *)
                     ((long)&(multiplier1->orientation).q_.v_.m_coeffs.
                             super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                             m_data + 8);
            dVar21 = dVar2 + dVar2;
            dVar3 = *(double *)
                     ((long)&(multiplier1->orientation).q_.v_.m_coeffs.
                             super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                             m_data + 0x10);
            dVar29 = dVar3 + dVar3;
            dVar4 = *(double *)
                     ((long)&(multiplier1->orientation).q_.v_.m_coeffs.
                             super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                             m_data + 0x18);
            dVar28 = dVar1 * (dVar1 + dVar1);
            dVar27 = (dVar1 + dVar1) * dVar4;
            dVar30 = dVar1 * dVar21 - dVar4 * dVar29;
            (multiplier1->orientation).m_.isSet_.b_ = true;
            (multiplier1->orientation).m_.v_.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
                 1.0 - (dVar21 * dVar2 + dVar29 * dVar3);
            *(double *)
             ((long)(multiplier1->orientation).m_.v_.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + 8) = dVar1 * dVar21 + dVar4 * dVar29;
            auVar12._8_4_ = SUB84(dVar30,0);
            auVar12._0_8_ = dVar1 * dVar29 - dVar21 * dVar4;
            auVar12._12_4_ = (int)((ulong)dVar30 >> 0x20);
            *(undefined1 (*) [16])
             ((long)(multiplier1->orientation).m_.v_.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + 0x10) = auVar12;
            *(double *)
             ((long)(multiplier1->orientation).m_.v_.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + 0x20) = 1.0 - (dVar29 * dVar3 + dVar28);
            *(double *)
             ((long)(multiplier1->orientation).m_.v_.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + 0x28) = dVar2 * dVar29 + dVar27;
            *(double *)
             ((long)(multiplier1->orientation).m_.v_.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + 0x30) = dVar1 * dVar29 + dVar21 * dVar4;
            *(double *)
             ((long)(multiplier1->orientation).m_.v_.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + 0x38) = dVar2 * dVar29 - dVar27;
            *(double *)
             ((long)(multiplier1->orientation).m_.v_.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + 0x40) = 1.0 - (dVar21 * dVar2 + dVar28);
          }
          if (((multiplier1->orientation).m_.isSet_.b_ != true) ||
             ((multiplier1->orientation).m_.assertMsg_.b_ == (char *)0x0)) {
LAB_0017b258:
            __function = 
            "bool stateObservation::CheckedItem<Eigen::Matrix<double, 3, 3>, false, false, true, true>::chckitm_check_() const [T = Eigen::Matrix<double, 3, 3>, lazy = false, alwaysCheck = false, assertion = true, eigenAlignedNew = true]"
            ;
            goto LAB_0017b22f;
          }
          dVar1 = (multiplier2->angVel).v_.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[0];
          dVar28 = *(double *)
                    ((long)(multiplier1->orientation).m_.v_.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data.array + 8);
          dVar2 = (multiplier2->angVel).v_.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[1];
          dVar29 = *(double *)
                    ((long)(multiplier1->orientation).m_.v_.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data.array + 0x20);
          dVar3 = (multiplier2->angVel).v_.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[2];
          dVar30 = *(double *)
                    ((long)(multiplier1->orientation).m_.v_.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data.array + 0x38);
          dVar4 = *(double *)
                   ((long)(multiplier1->orientation).m_.v_.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array + 0x10);
          dVar21 = *(double *)
                    ((long)(multiplier1->orientation).m_.v_.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data.array + 0x28);
          dVar27 = *(double *)
                    ((long)(multiplier1->orientation).m_.v_.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data.array + 0x40);
          (this->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[0] =
               dVar3 * *(double *)
                        ((long)(multiplier1->orientation).m_.v_.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data.array + 0x30) +
               dVar2 * *(double *)
                        ((long)(multiplier1->orientation).m_.v_.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data.array + 0x18) +
               dVar1 * (multiplier1->orientation).m_.v_.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                       .array[0];
          (this->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[1] = dVar3 * dVar30 + dVar2 * dVar29 + dVar1 * dVar28;
          (this->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[2] = dVar3 * dVar27 + dVar2 * dVar21 + dVar1 * dVar4;
          if (((multiplier2->angAcc).isSet_.b_ == true) && ((multiplier1->angAcc).isSet_.b_ == true)
             ) {
            (this->angAcc).isSet_.b_ = true;
            if (((multiplier2->angAcc).isSet_.b_ == true) &&
               ((multiplier2->angAcc).assertMsg_.b_ != (char *)0x0)) {
              bVar5 = (multiplier1->orientation).q_.isSet_.b_;
              if ((bVar5 == false) && ((multiplier1->orientation).m_.isSet_.b_ == false)) {
LAB_0017b28e:
                __assert_fail("(isQuaternionSet() || isMatrixSet()) && \"The orientation is not initialized\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/rigid-body-kinematics.hxx"
                              ,0x3ef,"void stateObservation::kine::Orientation::check_() const");
              }
              if ((multiplier1->orientation).m_.isSet_.b_ == false) {
                if ((bVar5 == false) || ((multiplier1->orientation).q_.assertMsg_.b_ == (char *)0x0)
                   ) goto LAB_0017b2ad;
                dVar1 = (multiplier1->orientation).q_.v_.m_coeffs.
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data.array[0];
                dVar2 = *(double *)
                         ((long)&(multiplier1->orientation).q_.v_.m_coeffs.
                                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                 m_storage.m_data + 8);
                dVar21 = dVar2 + dVar2;
                dVar3 = *(double *)
                         ((long)&(multiplier1->orientation).q_.v_.m_coeffs.
                                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                 m_storage.m_data + 0x10);
                dVar29 = dVar3 + dVar3;
                dVar4 = *(double *)
                         ((long)&(multiplier1->orientation).q_.v_.m_coeffs.
                                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                 m_storage.m_data + 0x18);
                dVar28 = dVar1 * (dVar1 + dVar1);
                dVar27 = (dVar1 + dVar1) * dVar4;
                dVar30 = dVar1 * dVar21 - dVar4 * dVar29;
                (multiplier1->orientation).m_.isSet_.b_ = true;
                (multiplier1->orientation).m_.v_.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                [0] = 1.0 - (dVar21 * dVar2 + dVar29 * dVar3);
                *(double *)
                 ((long)(multiplier1->orientation).m_.v_.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array + 8) = dVar1 * dVar21 + dVar4 * dVar29;
                auVar13._8_4_ = SUB84(dVar30,0);
                auVar13._0_8_ = dVar1 * dVar29 - dVar21 * dVar4;
                auVar13._12_4_ = (int)((ulong)dVar30 >> 0x20);
                *(undefined1 (*) [16])
                 ((long)(multiplier1->orientation).m_.v_.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array + 0x10) = auVar13;
                *(double *)
                 ((long)(multiplier1->orientation).m_.v_.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array + 0x20) = 1.0 - (dVar29 * dVar3 + dVar28);
                *(double *)
                 ((long)(multiplier1->orientation).m_.v_.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array + 0x28) = dVar2 * dVar29 + dVar27;
                *(double *)
                 ((long)(multiplier1->orientation).m_.v_.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array + 0x30) = dVar1 * dVar29 + dVar21 * dVar4;
                *(double *)
                 ((long)(multiplier1->orientation).m_.v_.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array + 0x38) = dVar2 * dVar29 - dVar27;
                *(double *)
                 ((long)(multiplier1->orientation).m_.v_.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array + 0x40) = 1.0 - (dVar21 * dVar2 + dVar28);
              }
              if (((multiplier1->orientation).m_.isSet_.b_ != true) ||
                 ((multiplier1->orientation).m_.assertMsg_.b_ == (char *)0x0)) goto LAB_0017b258;
              if (((this->angAcc).isSet_.b_ == true) &&
                 ((this->angAcc).assertMsg_.b_ != (char *)0x0)) {
                dVar1 = (multiplier2->angAcc).v_.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[0];
                dVar2 = (multiplier2->angAcc).v_.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[1];
                dVar3 = (multiplier2->angAcc).v_.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2];
                dVar4 = dVar3 * *(double *)
                                 ((long)(multiplier1->orientation).m_.v_.
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                        .m_storage.m_data.array + 0x30) +
                        dVar2 * *(double *)
                                 ((long)(multiplier1->orientation).m_.v_.
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                        .m_storage.m_data.array + 0x18) +
                        dVar1 * (multiplier1->orientation).m_.v_.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[0];
                dVar21 = dVar3 * *(double *)
                                  ((long)(multiplier1->orientation).m_.v_.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                         .m_storage.m_data.array + 0x38) +
                         dVar2 * *(double *)
                                  ((long)(multiplier1->orientation).m_.v_.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                         .m_storage.m_data.array + 0x20) +
                         dVar1 * *(double *)
                                  ((long)(multiplier1->orientation).m_.v_.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                         .m_storage.m_data.array + 8);
                dVar1 = dVar3 * *(double *)
                                 ((long)(multiplier1->orientation).m_.v_.
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                        .m_storage.m_data.array + 0x40) +
                        dVar2 * *(double *)
                                 ((long)(multiplier1->orientation).m_.v_.
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                        .m_storage.m_data.array + 0x28) +
                        dVar1 * *(double *)
                                 ((long)(multiplier1->orientation).m_.v_.
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                        .m_storage.m_data.array + 0x10);
                auVar17._8_4_ = SUB84(dVar21,0);
                auVar17._0_8_ = dVar4;
                auVar17._12_4_ = (int)((ulong)dVar21 >> 0x20);
                *(undefined1 (*) [16])
                 (this->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array = auVar17;
                (this->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array[2] = dVar1;
                if (((multiplier1->angVel).isSet_.b_ == true) &&
                   ((multiplier1->angVel).assertMsg_.b_ != (char *)0x0)) {
                  dVar2 = (multiplier1->angVel).v_.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[0];
                  dVar3 = (multiplier1->angVel).v_.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[1];
                  dVar27 = (this->angVel).v_.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array[2];
                  dVar28 = (multiplier1->angVel).v_.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array[2];
                  dVar29 = (this->angVel).v_.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array[0];
                  dVar30 = (this->angVel).v_.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array[1];
                  dVar4 = dVar4 + (dVar3 * dVar27 - dVar30 * dVar28);
                  dVar21 = dVar21 + (dVar28 * dVar29 - dVar27 * dVar2);
                  auVar18._8_4_ = SUB84(dVar21,0);
                  auVar18._0_8_ = dVar4;
                  auVar18._12_4_ = (int)((ulong)dVar21 >> 0x20);
                  *(undefined1 (*) [16])
                   (this->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array = auVar18;
                  dVar1 = dVar1 + (dVar2 * dVar30 - dVar29 * dVar3);
                  (this->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[2] = dVar1;
                  if (((multiplier1->angAcc).isSet_.b_ == true) &&
                     ((multiplier1->angAcc).assertMsg_.b_ != (char *)0x0)) {
                    dVar21 = dVar21 + (multiplier1->angAcc).v_.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                      m_storage.m_data.array[1];
                    auVar19._8_4_ = SUB84(dVar21,0);
                    auVar19._0_8_ =
                         dVar4 + (multiplier1->angAcc).v_.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[0];
                    auVar19._12_4_ = (int)((ulong)dVar21 >> 0x20);
                    *(undefined1 (*) [16])
                     (this->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array = auVar19;
                    (this->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2] =
                         dVar1 + (multiplier1->angAcc).v_.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[2];
                    goto LAB_0017b138;
                  }
                }
              }
            }
          }
          else {
            (this->angAcc).isSet_.b_ = false;
LAB_0017b138:
            if (((((multiplier1->angVel).isSet_.b_ == true) &&
                 ((multiplier1->angVel).assertMsg_.b_ != (char *)0x0)) &&
                ((this->angVel).isSet_.b_ == true)) && ((this->angVel).assertMsg_.b_ != (char *)0x0)
               ) {
              dVar1 = (this->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                      .m_storage.m_data.array[1] +
                      (multiplier1->angVel).v_.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array[1];
              auVar20._8_4_ = SUB84(dVar1,0);
              auVar20._0_8_ =
                   (this->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[0] +
                   (multiplier1->angVel).v_.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[0];
              auVar20._12_4_ = (int)((ulong)dVar1 >> 0x20);
              *(undefined1 (*) [16])
               (this->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array = auVar20;
              (this->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[2] =
                   (multiplier1->angVel).v_.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[2] +
                   (this->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[2];
              goto LAB_0017af1b;
            }
          }
        }
        goto LAB_0017b21a;
      }
    }
    (this->angVel).isSet_.b_ = false;
    (this->angAcc).isSet_.b_ = false;
LAB_0017af1b:
    (__return_storage_ptr__->position)._vptr_CheckedItem = (_func_int **)&PTR__CheckedItem_001b6b30;
    (__return_storage_ptr__->position).isSet_.b_ = true;
    puVar22 = detail::DebugItemDefaultError<(stateObservation::detail::errorType)0,0>::v;
    (__return_storage_ptr__->position).assertMsg_.b_ =
         detail::DebugItemDefaultError<(stateObservation::detail::errorType)0,0>::v;
    dVar1 = (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[1];
    (__return_storage_ptr__->position).v_.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[0];
    (__return_storage_ptr__->position).v_.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = dVar1;
    (__return_storage_ptr__->position).v_.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[2];
    (__return_storage_ptr__->position).isSet_.b_ = (this->position).isSet_.b_;
    (__return_storage_ptr__->position).assertMsg_.b_ = (this->position).assertMsg_.b_;
    (__return_storage_ptr__->orientation).q_._vptr_CheckedItem =
         (_func_int **)&PTR__CheckedItem_001b6b60;
    (__return_storage_ptr__->orientation).q_.isSet_.b_ = true;
    (__return_storage_ptr__->orientation).q_.assertMsg_.b_ = puVar22;
    dVar1 = *(double *)
             ((long)&(this->orientation).q_.v_.m_coeffs.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data +
             8);
    dVar2 = *(double *)
             ((long)&(this->orientation).q_.v_.m_coeffs.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data +
             0x10);
    dVar3 = *(double *)
             ((long)&(this->orientation).q_.v_.m_coeffs.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data +
             0x18);
    (__return_storage_ptr__->orientation).q_.v_.m_coeffs.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
         (this->orientation).q_.v_.m_coeffs.
         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0];
    *(double *)
     ((long)&(__return_storage_ptr__->orientation).q_.v_.m_coeffs.
             super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data + 8) =
         dVar1;
    *(double *)
     ((long)&(__return_storage_ptr__->orientation).q_.v_.m_coeffs.
             super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data + 0x10) =
         dVar2;
    *(double *)
     ((long)&(__return_storage_ptr__->orientation).q_.v_.m_coeffs.
             super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data + 0x18) =
         dVar3;
    (__return_storage_ptr__->orientation).q_.isSet_.b_ = (this->orientation).q_.isSet_.b_;
    (__return_storage_ptr__->orientation).q_.assertMsg_.b_ = (this->orientation).q_.assertMsg_.b_;
    (__return_storage_ptr__->orientation).m_._vptr_CheckedItem =
         (_func_int **)&PTR__CheckedItem_001b6b90;
    (__return_storage_ptr__->orientation).m_.isSet_.b_ = true;
    (__return_storage_ptr__->orientation).m_.assertMsg_.b_ = puVar22;
    pMVar24 = &(this->orientation).m_.v_;
    pMVar25 = &(__return_storage_ptr__->orientation).m_.v_;
    for (lVar23 = 9; lVar23 != 0; lVar23 = lVar23 + -1) {
      (pMVar25->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
      [0] = (pMVar24->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
            .array[0];
      pMVar24 = (Matrix<double,_3,_3,_0,_3,_3> *)((long)pMVar24 + (ulong)bVar26 * -0x10 + 8);
      pMVar25 = (Matrix<double,_3,_3,_0,_3,_3> *)((long)pMVar25 + (ulong)bVar26 * -0x10 + 8);
    }
    (__return_storage_ptr__->orientation).m_.isSet_.b_ = (this->orientation).m_.isSet_.b_;
    (__return_storage_ptr__->orientation).m_.assertMsg_.b_ = (this->orientation).m_.assertMsg_.b_;
    (__return_storage_ptr__->linVel)._vptr_CheckedItem = (_func_int **)&PTR__CheckedItem_001b6b30;
    (__return_storage_ptr__->linVel).isSet_.b_ = true;
    (__return_storage_ptr__->linVel).assertMsg_.b_ = puVar22;
    dVar1 = (this->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
            .m_data.array[1];
    (__return_storage_ptr__->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[0] =
         (this->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[0];
    (__return_storage_ptr__->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[1] = dVar1;
    (__return_storage_ptr__->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[2] =
         (this->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[2];
    (__return_storage_ptr__->linVel).isSet_.b_ = (this->linVel).isSet_.b_;
    (__return_storage_ptr__->linVel).assertMsg_.b_ = (this->linVel).assertMsg_.b_;
    (__return_storage_ptr__->angVel)._vptr_CheckedItem = (_func_int **)&PTR__CheckedItem_001b6b30;
    (__return_storage_ptr__->angVel).isSet_.b_ = true;
    (__return_storage_ptr__->angVel).assertMsg_.b_ = puVar22;
    dVar1 = (this->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
            .m_data.array[1];
    (__return_storage_ptr__->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[0] =
         (this->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[0];
    (__return_storage_ptr__->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[1] = dVar1;
    (__return_storage_ptr__->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[2] =
         (this->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[2];
    (__return_storage_ptr__->angVel).isSet_.b_ = (this->angVel).isSet_.b_;
    (__return_storage_ptr__->angVel).assertMsg_.b_ = (this->angVel).assertMsg_.b_;
    (__return_storage_ptr__->linAcc)._vptr_CheckedItem = (_func_int **)&PTR__CheckedItem_001b6b30;
    (__return_storage_ptr__->linAcc).isSet_.b_ = true;
    (__return_storage_ptr__->linAcc).assertMsg_.b_ = puVar22;
    dVar1 = (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
            .m_data.array[1];
    (__return_storage_ptr__->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[0] =
         (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[0];
    (__return_storage_ptr__->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[1] = dVar1;
    (__return_storage_ptr__->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[2] =
         (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[2];
    (__return_storage_ptr__->linAcc).isSet_.b_ = (this->linAcc).isSet_.b_;
    (__return_storage_ptr__->linAcc).assertMsg_.b_ = (this->linAcc).assertMsg_.b_;
    (__return_storage_ptr__->angAcc)._vptr_CheckedItem = (_func_int **)&PTR__CheckedItem_001b6b30;
    (__return_storage_ptr__->angAcc).isSet_.b_ = true;
    (__return_storage_ptr__->angAcc).assertMsg_.b_ = puVar22;
    dVar1 = (this->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
            .m_data.array[1];
    (__return_storage_ptr__->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[0] =
         (this->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[0];
    (__return_storage_ptr__->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[1] = dVar1;
    (__return_storage_ptr__->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[2] =
         (this->angAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[2];
    (__return_storage_ptr__->angAcc).isSet_.b_ = (this->angAcc).isSet_.b_;
    (__return_storage_ptr__->angAcc).assertMsg_.b_ = (this->angAcc).assertMsg_.b_;
    dVar1 = (this->tempVec_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[1];
    (__return_storage_ptr__->tempVec_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[0] =
         (this->tempVec_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[0];
    (__return_storage_ptr__->tempVec_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[1] = dVar1;
    (__return_storage_ptr__->tempVec_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[2] =
         (this->tempVec_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[2];
    return __return_storage_ptr__;
  }
  if ((multiplier1->position).isSet_.b_ != true) goto LAB_0017a8ed;
  (this->position).isSet_.b_ = true;
  if ((((this->position).assertMsg_.b_ == (char *)0x0) ||
      ((multiplier2->position).isSet_.b_ != true)) ||
     ((multiplier2->position).assertMsg_.b_ == (char *)0x0)) goto LAB_0017b21a;
  bVar5 = (multiplier1->orientation).q_.isSet_.b_;
  if ((bVar5 == false) && ((multiplier1->orientation).m_.isSet_.b_ == false)) goto LAB_0017b28e;
  if ((multiplier1->orientation).m_.isSet_.b_ == false) {
    if ((bVar5 != false) && ((multiplier1->orientation).q_.assertMsg_.b_ != (char *)0x0)) {
      dVar1 = (multiplier1->orientation).q_.v_.m_coeffs.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
      ;
      dVar2 = *(double *)
               ((long)&(multiplier1->orientation).q_.v_.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
               + 8);
      dVar21 = dVar2 + dVar2;
      dVar3 = *(double *)
               ((long)&(multiplier1->orientation).q_.v_.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
               + 0x10);
      dVar29 = dVar3 + dVar3;
      dVar4 = *(double *)
               ((long)&(multiplier1->orientation).q_.v_.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
               + 0x18);
      dVar28 = dVar1 * (dVar1 + dVar1);
      dVar27 = (dVar1 + dVar1) * dVar4;
      dVar30 = dVar1 * dVar21 - dVar4 * dVar29;
      (multiplier1->orientation).m_.isSet_.b_ = true;
      (multiplier1->orientation).m_.v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] = 1.0 - (dVar21 * dVar2 + dVar29 * dVar3);
      *(double *)
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       8) = dVar1 * dVar21 + dVar4 * dVar29;
      auVar6._8_4_ = SUB84(dVar30,0);
      auVar6._0_8_ = dVar1 * dVar29 - dVar21 * dVar4;
      auVar6._12_4_ = (int)((ulong)dVar30 >> 0x20);
      *(undefined1 (*) [16])
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       0x10) = auVar6;
      *(double *)
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       0x20) = 1.0 - (dVar29 * dVar3 + dVar28);
      *(double *)
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       0x28) = dVar2 * dVar29 + dVar27;
      *(double *)
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       0x30) = dVar1 * dVar29 + dVar21 * dVar4;
      *(double *)
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       0x38) = dVar2 * dVar29 - dVar27;
      *(double *)
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       0x40) = 1.0 - (dVar21 * dVar2 + dVar28);
      goto LAB_0017a376;
    }
LAB_0017b2ad:
    __function = 
    "bool stateObservation::CheckedItem<Eigen::Quaternion<double>, false, false, true, true>::chckitm_check_() const [T = Eigen::Quaternion<double>, lazy = false, alwaysCheck = false, assertion = true, eigenAlignedNew = true]"
    ;
    goto LAB_0017b22f;
  }
LAB_0017a376:
  if (((multiplier1->orientation).m_.isSet_.b_ != true) ||
     ((multiplier1->orientation).m_.assertMsg_.b_ == (char *)0x0)) goto LAB_0017b258;
  dVar1 = (multiplier2->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[0];
  dVar28 = *(double *)
            ((long)(multiplier1->orientation).m_.v_.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array + 8);
  dVar2 = (multiplier2->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[1];
  dVar29 = *(double *)
            ((long)(multiplier1->orientation).m_.v_.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array + 0x20);
  dVar3 = (multiplier2->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[2];
  dVar30 = *(double *)
            ((long)(multiplier1->orientation).m_.v_.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array + 0x38);
  dVar4 = *(double *)
           ((long)(multiplier1->orientation).m_.v_.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array + 0x10);
  dVar21 = *(double *)
            ((long)(multiplier1->orientation).m_.v_.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array + 0x28);
  dVar27 = *(double *)
            ((long)(multiplier1->orientation).m_.v_.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array + 0x40);
  (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[0] = dVar3 * *(double *)
                      ((long)(multiplier1->orientation).m_.v_.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data.array + 0x30) +
             dVar2 * *(double *)
                      ((long)(multiplier1->orientation).m_.v_.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data.array + 0x18) +
             dVar1 * (multiplier1->orientation).m_.v_.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[0];
  (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[1] = dVar3 * dVar30 + dVar2 * dVar29 + dVar1 * dVar28;
  (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[2] = dVar3 * dVar27 + dVar2 * dVar21 + dVar1 * dVar4;
  if (((multiplier2->linVel).isSet_.b_ != true) ||
     (((multiplier1->linVel).isSet_.b_ != true || ((multiplier1->angVel).isSet_.b_ != true)))) {
    (this->linVel).isSet_.b_ = false;
    (this->linAcc).isSet_.b_ = false;
LAB_0017a913:
    if ((((multiplier1->position).isSet_.b_ != true) ||
        ((multiplier1->position).assertMsg_.b_ == (char *)0x0)) ||
       (((this->position).isSet_.b_ != true || ((this->position).assertMsg_.b_ == (char *)0x0))))
    goto LAB_0017b21a;
    dVar1 = (multiplier1->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[1] +
            (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[1];
    auVar11._8_4_ = SUB84(dVar1,0);
    auVar11._0_8_ =
         (multiplier1->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[0] +
         (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[0];
    auVar11._12_4_ = (int)((ulong)dVar1 >> 0x20);
    *(undefined1 (*) [16])
     (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
     m_data.array = auVar11;
    (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[2] =
         (multiplier1->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[2] +
         (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[2];
    goto LAB_0017a963;
  }
  if ((multiplier2->linVel).assertMsg_.b_ != (char *)0x0) {
    bVar5 = (multiplier1->orientation).q_.isSet_.b_;
    if ((bVar5 == false) && ((multiplier1->orientation).m_.isSet_.b_ == false)) goto LAB_0017b28e;
    if ((multiplier1->orientation).m_.isSet_.b_ == false) {
      if ((bVar5 == false) || ((multiplier1->orientation).q_.assertMsg_.b_ == (char *)0x0))
      goto LAB_0017b2ad;
      dVar1 = (multiplier1->orientation).q_.v_.m_coeffs.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
      ;
      dVar2 = *(double *)
               ((long)&(multiplier1->orientation).q_.v_.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
               + 8);
      dVar21 = dVar2 + dVar2;
      dVar3 = *(double *)
               ((long)&(multiplier1->orientation).q_.v_.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
               + 0x10);
      dVar29 = dVar3 + dVar3;
      dVar4 = *(double *)
               ((long)&(multiplier1->orientation).q_.v_.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
               + 0x18);
      dVar28 = dVar1 * (dVar1 + dVar1);
      dVar27 = (dVar1 + dVar1) * dVar4;
      dVar30 = dVar1 * dVar21 - dVar4 * dVar29;
      (multiplier1->orientation).m_.isSet_.b_ = true;
      (multiplier1->orientation).m_.v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] = 1.0 - (dVar21 * dVar2 + dVar29 * dVar3);
      *(double *)
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       8) = dVar1 * dVar21 + dVar4 * dVar29;
      auVar7._8_4_ = SUB84(dVar30,0);
      auVar7._0_8_ = dVar1 * dVar29 - dVar21 * dVar4;
      auVar7._12_4_ = (int)((ulong)dVar30 >> 0x20);
      *(undefined1 (*) [16])
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       0x10) = auVar7;
      *(double *)
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       0x20) = 1.0 - (dVar29 * dVar3 + dVar28);
      *(double *)
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       0x28) = dVar2 * dVar29 + dVar27;
      *(double *)
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       0x30) = dVar1 * dVar29 + dVar21 * dVar4;
      *(double *)
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       0x38) = dVar2 * dVar29 - dVar27;
      *(double *)
       ((long)(multiplier1->orientation).m_.v_.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
       0x40) = 1.0 - (dVar21 * dVar2 + dVar28);
    }
    if (((multiplier1->orientation).m_.isSet_.b_ != true) ||
       ((multiplier1->orientation).m_.assertMsg_.b_ == (char *)0x0)) goto LAB_0017b258;
    dVar1 = (multiplier2->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[0];
    dVar2 = (multiplier2->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[1];
    dVar3 = (multiplier2->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[2];
    dVar4 = dVar3 * *(double *)
                     ((long)(multiplier1->orientation).m_.v_.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array + 0x30) +
            dVar2 * *(double *)
                     ((long)(multiplier1->orientation).m_.v_.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array + 0x18) +
            dVar1 * (multiplier1->orientation).m_.v_.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[0];
    dVar21 = dVar3 * *(double *)
                      ((long)(multiplier1->orientation).m_.v_.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data.array + 0x38) +
             dVar2 * *(double *)
                      ((long)(multiplier1->orientation).m_.v_.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data.array + 0x20) +
             dVar1 * *(double *)
                      ((long)(multiplier1->orientation).m_.v_.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data.array + 8);
    dVar1 = dVar3 * *(double *)
                     ((long)(multiplier1->orientation).m_.v_.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array + 0x40) +
            dVar2 * *(double *)
                     ((long)(multiplier1->orientation).m_.v_.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array + 0x28) +
            dVar1 * *(double *)
                     ((long)(multiplier1->orientation).m_.v_.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array + 0x10);
    auVar14._8_4_ = SUB84(dVar21,0);
    auVar14._0_8_ = dVar4;
    auVar14._12_4_ = (int)((ulong)dVar21 >> 0x20);
    *(undefined1 (*) [16])
     (this->tempVec_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
     array = auVar14;
    (this->tempVec_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[2] = dVar1;
    (this->linVel).isSet_.b_ = true;
    if (((this->linVel).assertMsg_.b_ != (char *)0x0) &&
       (((multiplier1->angVel).isSet_.b_ == true &&
        ((multiplier1->angVel).assertMsg_.b_ != (char *)0x0)))) {
      dVar2 = (multiplier1->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[0];
      dVar3 = (multiplier1->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[1];
      dVar27 = (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[2];
      dVar28 = (multiplier1->angVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
               .m_storage.m_data.array[2];
      dVar29 = (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[0];
      dVar30 = (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[1];
      dVar21 = dVar21 + (dVar28 * dVar29 - dVar27 * dVar2);
      auVar15._8_4_ = SUB84(dVar21,0);
      auVar15._0_8_ = dVar4 + (dVar3 * dVar27 - dVar30 * dVar28);
      auVar15._12_4_ = (int)((ulong)dVar21 >> 0x20);
      *(undefined1 (*) [16])
       (this->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
       m_data.array = auVar15;
      (this->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[2] = dVar1 + (dVar2 * dVar30 - dVar29 * dVar3);
      if (((multiplier2->linAcc).isSet_.b_ == true) &&
         (((multiplier1->linAcc).isSet_.b_ == true && ((multiplier1->angAcc).isSet_.b_ == true)))) {
        (this->linAcc).isSet_.b_ = true;
        if (((((multiplier2->linAcc).isSet_.b_ == true) &&
             ((multiplier2->linAcc).assertMsg_.b_ != (char *)0x0)) &&
            (Orientation::operator*(&local_58,&multiplier1->orientation,&(multiplier2->linAcc).v_),
            (this->linAcc).isSet_.b_ == true)) && ((this->linAcc).assertMsg_.b_ != (char *)0x0)) {
          (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[0] =
               local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0];
          (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[1] =
               local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1];
          (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[2] =
               local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
          if (((multiplier1->angAcc).isSet_.b_ == true) &&
             ((multiplier1->angAcc).assertMsg_.b_ != (char *)0x0)) {
            dVar1 = (multiplier1->angAcc).v_.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                    array[0];
            dVar2 = (multiplier1->angAcc).v_.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                    array[1];
            dVar3 = (this->position).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    .m_storage.m_data.array[2];
            dVar4 = (multiplier1->angAcc).v_.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                    array[2];
            dVar21 = (this->position).v_.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[0];
            dVar27 = (this->position).v_.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[1];
            dVar28 = local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[1] + (dVar4 * dVar21 - dVar3 * dVar1);
            auVar16._8_4_ = SUB84(dVar28,0);
            auVar16._0_8_ =
                 local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0] + (dVar2 * dVar3 - dVar27 * dVar4);
            auVar16._12_4_ = (int)((ulong)dVar28 >> 0x20);
            *(undefined1 (*) [16])
             (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array = auVar16;
            (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
            .m_data.array[2] =
                 local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2] + (dVar1 * dVar27 - dVar21 * dVar2);
            if (((multiplier1->angVel).isSet_.b_ == true) &&
               ((multiplier1->angVel).assertMsg_.b_ != (char *)0x0)) {
              local_38 = &this->tempVec_;
              local_40 = &(this->linVel).v_;
              Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
              cross<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                        (&local_58,&(multiplier1->angVel).v_,
                         (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          *)&local_40);
              if (((this->linAcc).isSet_.b_ == true) &&
                 ((this->linAcc).assertMsg_.b_ != (char *)0x0)) {
                local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0] =
                     local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[0] +
                     (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0];
                local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[1] =
                     local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[1] +
                     (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[1];
                auVar8._8_4_ = SUB84(local_58.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                     m_storage.m_data.array[1],0);
                auVar8._0_8_ = local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                               .m_storage.m_data.array[0];
                auVar8._12_4_ =
                     (int)((ulong)local_58.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[1] >> 0x20);
                *(undefined1 (*) [16])
                 (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array = auVar8;
                local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[2] =
                     local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[2] +
                     (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2];
                (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array[2] =
                     local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[2];
                if (((multiplier1->linAcc).isSet_.b_ == true) &&
                   ((multiplier1->linAcc).assertMsg_.b_ != (char *)0x0)) {
                  local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[1] =
                       local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[1] +
                       (multiplier1->linAcc).v_.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[1];
                  auVar9._8_4_ = SUB84(local_58.
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                       m_storage.m_data.array[1],0);
                  auVar9._0_8_ = local_58.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[0] +
                                 (multiplier1->linAcc).v_.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[0];
                  auVar9._12_4_ =
                       (int)((ulong)local_58.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                    m_storage.m_data.array[1] >> 0x20);
                  *(undefined1 (*) [16])
                   (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array = auVar9;
                  (this->linAcc).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[2] =
                       local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[2] +
                       (multiplier1->linAcc).v_.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[2];
                  goto LAB_0017b1b7;
                }
              }
            }
          }
        }
      }
      else {
        (this->linAcc).isSet_.b_ = false;
LAB_0017b1b7:
        if (((((multiplier1->linVel).isSet_.b_ == true) &&
             ((multiplier1->linVel).assertMsg_.b_ != (char *)0x0)) &&
            ((this->linVel).isSet_.b_ == true)) && ((this->linVel).assertMsg_.b_ != (char *)0x0)) {
          dVar1 = (multiplier1->linVel).v_.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[1] +
                  (this->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[1];
          auVar10._8_4_ = SUB84(dVar1,0);
          auVar10._0_8_ =
               (multiplier1->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
               .m_storage.m_data.array[0] +
               (this->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[0];
          auVar10._12_4_ = (int)((ulong)dVar1 >> 0x20);
          *(undefined1 (*) [16])
           (this->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
           m_data.array = auVar10;
          (this->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[2] =
               (multiplier1->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
               .m_storage.m_data.array[2] +
               (this->linVel).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[2];
          goto LAB_0017a913;
        }
      }
    }
  }
LAB_0017b21a:
  __function = 
  "bool stateObservation::CheckedItem<Eigen::Matrix<double, 3, 1>, false, false, true, true>::chckitm_check_() const [T = Eigen::Matrix<double, 3, 1>, lazy = false, alwaysCheck = false, assertion = true, eigenAlignedNew = true]"
  ;
LAB_0017b22f:
  __assert_fail("(isSet())&&(assertMsg_.get())",
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                ,0x69,__function);
}

Assistant:

inline Kinematics Kinematics::setToProductNoAlias(const Kinematics & multiplier1, const Kinematics & multiplier2)
{
  BOOST_ASSERT(multiplier1.orientation.isSet()
               && "The multiplier 1 orientation is not initialized, the multiplication is not possible.");

  BOOST_ASSERT((multiplier2.position.isSet() || multiplier2.orientation.isSet())
               && "The multiplier 2 kinematics is not initialized, the multiplication is not possible.");

  if(multiplier2.position.isSet() && multiplier1.position.isSet())
  {
    position.set(true);
    Vector3 & R1p2 = position(); /// reference ( Vector3&  )
    R1p2.noalias() = multiplier1.orientation * multiplier2.position();

    if(multiplier2.linVel.isSet() && multiplier1.linVel.isSet() && multiplier1.angVel.isSet())
    {
      Vector3 & R1p2d = tempVec_; /// reference
      R1p2d.noalias() = multiplier1.orientation * multiplier2.linVel();

      linVel.set(true);
      Vector3 & w1xR1p2 = linVel(); /// reference
      w1xR1p2.noalias() = multiplier1.angVel().cross(R1p2);

      Vector3 & w1xR1p2_R1p2d = w1xR1p2; ///  reference ( =linVel() )
      w1xR1p2_R1p2d += R1p2d;

      if(multiplier2.linAcc.isSet() && multiplier1.linAcc.isSet() && multiplier1.angAcc.isSet())
      {
        linAcc.set(true);
        linAcc().noalias() = multiplier1.orientation * multiplier2.linAcc();
        linAcc().noalias() += multiplier1.angAcc().cross(R1p2);
        linAcc().noalias() += multiplier1.angVel().cross(w1xR1p2_R1p2d + R1p2d);
        linAcc() += multiplier1.linAcc();
      }
      else
      {
        linAcc.reset();
      }

      linVel() += multiplier1.linVel();
    }
    else
    {
      linVel.reset();
      linAcc.reset();
    }

    position() += multiplier1.position();
  }
  else
  {
    position.reset();
    linVel.reset();
    linAcc.reset();
  }

  if(multiplier2.orientation.isSet())
  {
    orientation.setToProductNoAlias(multiplier1.orientation, multiplier2.orientation);

    if(multiplier2.angVel.isSet() && multiplier1.angVel.isSet())
    {
      angVel.set(true);
      Vector3 & R1w2 = angVel(); /// reference
      R1w2.noalias() = multiplier1.orientation * multiplier2.angVel();

      if(multiplier2.angAcc.isSet() && multiplier1.angAcc.isSet())
      {
        angAcc.set(true);
        angAcc().noalias() = multiplier1.orientation * multiplier2.angAcc();
        angAcc().noalias() += multiplier1.angVel().cross(R1w2);
        angAcc() += multiplier1.angAcc();
      }
      else
      {
        angAcc.reset();
      }

      angVel() += multiplier1.angVel();
    }
    else
    {
      angVel.reset();
      angAcc.reset();
    }
  }
  else
  {
    orientation.reset();
    angVel.reset();
    angAcc.reset();
  }

  return *this;
}